

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_atomic_test.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  iVar1 = hdr_histogram_run_tests();
  return iVar1;
}

Assistant:

int main(void)
{
    return hdr_histogram_run_tests();
}